

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase451::run(TestCase451 *this)

{
  SegmentBuilder *pSVar1;
  SegmentBuilder *pSVar2;
  word *params_1;
  word *params_2;
  Reader value;
  Reader value_00;
  initializer_list<int> value_01;
  initializer_list<int> value_02;
  initializer_list<int> value_03;
  initializer_list<capnp::Text::Reader> value_04;
  initializer_list<capnp::Text::Reader> value_05;
  initializer_list<capnp::Text::Reader> value_06;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  Builder sl;
  MallocMessageBuilder defaultBuilder;
  Builder root;
  MallocMessageBuilder builder;
  undefined1 local_2c8 [24];
  WirePointer *local_2b0;
  StructBuilder local_2a0;
  ListBuilder local_278;
  PointerBuilder local_250;
  MallocMessageBuilder local_238;
  StructBuilder local_148;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2a0,&local_120.super_MessageBuilder);
  local_238.super_MessageBuilder.arenaSpace[1] = local_2a0.data;
  local_238.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_2a0.segment;
  local_238.super_MessageBuilder.arenaSpace[0] = local_2a0.capTable;
  PointerBuilder::getStruct(&local_148,(PointerBuilder *)&local_238,(StructSize)0x10000,(word *)0x0)
  ;
  local_238.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_148.segment;
  local_238.super_MessageBuilder.arenaSpace[0] = local_148.capTable;
  local_238.super_MessageBuilder.arenaSpace[1] = local_148.pointers;
  PointerBuilder::initStruct(&local_2a0,(PointerBuilder *)&local_238,(StructSize)0xa0000);
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  local_2c8._16_8_ = local_2a0.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x0,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    local_2c8._16_8_ = local_2a0.pointers;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x0,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1cc,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList0 ().size())\", 0u, sl.getList0 ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList0 ().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 1;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 1;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1cd,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList1 ().size())\", 0u, sl.getList1 ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList1 ().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 2;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 2;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1ce,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList8 ().size())\", 0u, sl.getList8 ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList8 ().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 3;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 3;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1cf,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList16().size())\", 0u, sl.getList16().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList16().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 4;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 4;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList32().size())\", 0u, sl.getList32().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList32().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 5;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 5;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x1,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d1,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList64().size())\", 0u, sl.getList64().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList64().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 6;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x10000,(word *)0x0);
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 6;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,(StructSize)0x10000,(word *)0x0
              );
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d2,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getListP ().size())\", 0u, sl.getListP ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getListP ().size())",(uint *)&local_278
               ,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 7;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getList((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,(word *)0x0)
  ;
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 7;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d3,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getInt32ListList().size())\", 0u, sl.getInt32ListList().size()"
               ,(char (*) [56])"failed: expected (0u) == (sl.getInt32ListList().size())",
               (uint *)&local_278,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 8;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getList((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,(word *)0x0)
  ;
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 8;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d4,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getTextListList().size())\", 0u, sl.getTextListList().size()"
               ,(char (*) [55])"failed: expected (0u) == (sl.getTextListList().size())",
               (uint *)&local_278,(uint *)&local_250);
  }
  local_2c8._16_8_ = local_2a0.pointers + 9;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::getList((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,(word *)0x0)
  ;
  if (((int)local_238.super_MessageBuilder.arenaSpace[2] != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_278.segment = (SegmentBuilder *)((ulong)local_278.segment & 0xffffffff00000000);
    local_2c8._16_8_ = local_2a0.pointers + 9;
    local_2c8._0_8_ = local_2a0.segment;
    local_2c8._8_8_ = local_2a0.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,(word *)0x0);
    local_250.segment =
         (SegmentBuilder *)
         CONCAT44(local_250.segment._4_4_,(int)local_238.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d5,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getStructListList().size())\", 0u, sl.getStructListList().size()"
               ,(char (*) [57])"failed: expected (0u) == (sl.getStructListList().size())",
               (uint *)&local_278,(uint *)&local_250);
  }
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  local_2c8._16_8_ = local_2a0.pointers;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,2,(StructSize)0x0);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  local_2c8._16_8_ = local_2a0.pointers + 1;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,4,(StructSize)0x1);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  *(byte *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value =
       (byte)((WireValue<uint32_t> *)local_2c8._16_8_)->value | 1;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  *(byte *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value =
       (byte)((WireValue<uint32_t> *)local_2c8._16_8_)->value & 0xfe;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,2);
  *(byte *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value =
       (byte)((WireValue<uint32_t> *)local_2c8._16_8_)->value | 1;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,3);
  *(byte *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value =
       (byte)((WireValue<uint32_t> *)local_2c8._16_8_)->value | 1;
  local_2c8._16_8_ = local_2a0.pointers + 2;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,2,(StructSize)0x1);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  *(undefined1 *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value = 0x7b;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  *(undefined1 *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value = 0x2d;
  local_2c8._16_8_ = local_2a0.pointers + 3;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,2,(StructSize)0x1);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  *(undefined2 *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value = 0x3039;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  *(undefined2 *)&((WireValue<uint32_t> *)local_2c8._16_8_)->value = 0x1a85;
  local_2c8._16_8_ = local_2a0.pointers + 4;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,2,(StructSize)0x1);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  ((WireValue<uint32_t> *)local_2c8._16_8_)->value = 0x75bcd15;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  ((WireValue<uint32_t> *)local_2c8._16_8_)->value = 0xdfb38d2;
  local_2c8._16_8_ = local_2a0.pointers + 5;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,2,(StructSize)0x1);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  *(WirePointer *)local_2c8._16_8_ = (WirePointer)0x462d53c8abac0;
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  *(WirePointer *)local_2c8._16_8_ = (WirePointer)0x85561edaa4b87;
  local_2c8._16_8_ = local_2a0.pointers + 6;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initStructList
            ((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,2,(StructSize)0x10000);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,0);
  local_278.segment = (SegmentBuilder *)local_2c8._0_8_;
  local_278.capTable = (CapTableBuilder *)local_2c8._8_8_;
  local_278.ptr = (byte *)local_2b0;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_278,value);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,(ListBuilder *)&local_238,1);
  local_278.segment = (SegmentBuilder *)local_2c8._0_8_;
  local_278.capTable = (CapTableBuilder *)local_2c8._8_8_;
  local_278.ptr = (byte *)local_2b0;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_278,value_00);
  local_2c8._16_8_ = local_2a0.pointers + 7;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initList((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,3);
  local_2c8._0_8_ = (SegmentBuilder *)0x200000001;
  local_2c8._8_4_ = 3;
  value_01._M_len = 3;
  value_01._M_array = (iterator)local_2c8;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_238,0,value_01);
  local_2c8._0_8_ = (SegmentBuilder *)0x500000004;
  value_02._M_len = 2;
  value_02._M_array = (iterator)local_2c8;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_238,1,value_02);
  local_2c8._0_4_ = 0xbc4ff2;
  value_03._M_len = 1;
  value_03._M_array = (iterator)local_2c8;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_238,2,value_03);
  local_2c8._16_8_ = local_2a0.pointers + 8;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initList((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,3);
  local_2c8._0_8_ = "foo";
  local_2c8._8_8_ = (CapTableBuilder *)0x4;
  local_2c8._16_8_ = "bar";
  local_2b0 = (WirePointer *)0x4;
  value_04._M_len = 2;
  value_04._M_array = (iterator)local_2c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_238,0,value_04);
  local_2c8._0_8_ = "baz";
  local_2c8._8_8_ = (CapTableBuilder *)0x4;
  value_05._M_len = 1;
  value_05._M_array = (iterator)local_2c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_238,1,value_05);
  local_2c8._0_8_ = "qux";
  local_2c8._8_8_ = (CapTableBuilder *)0x4;
  local_2c8._16_8_ = "corge";
  local_2b0 = (WirePointer *)0x6;
  value_06._M_len = 2;
  value_06._M_array = (iterator)local_2c8;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&local_238,2,value_06);
  local_2c8._16_8_ = local_2a0.pointers + 9;
  local_2c8._0_8_ = local_2a0.segment;
  local_2c8._8_8_ = local_2a0.capTable;
  PointerBuilder::initList((ListBuilder *)&local_238,(PointerBuilder *)local_2c8,POINTER,2);
  local_278.segment = (SegmentBuilder *)local_238.super_MessageBuilder._vptr_MessageBuilder;
  local_278.capTable = (CapTableBuilder *)local_238.super_MessageBuilder.arenaSpace[0];
  local_278.ptr = (byte *)local_238.super_MessageBuilder.arenaSpace[1];
  PointerBuilder::initStructList
            ((ListBuilder *)local_2c8,(PointerBuilder *)&local_278,2,(StructSize)0x140006);
  local_278.ptr =
       (byte *)((long)&((WireValue<uint32_t> *)local_238.super_MessageBuilder.arenaSpace[1])->value
               + (ulong)(local_238.super_MessageBuilder.arenaSpace[2]._4_4_ >> 3));
  local_278.segment = (SegmentBuilder *)local_238.super_MessageBuilder._vptr_MessageBuilder;
  local_278.capTable = (CapTableBuilder *)local_238.super_MessageBuilder.arenaSpace[0];
  PointerBuilder::initStructList
            ((ListBuilder *)local_2c8,(PointerBuilder *)&local_278,1,(StructSize)0x140006);
  local_250.segment = (SegmentBuilder *)local_238.super_MessageBuilder._vptr_MessageBuilder;
  local_250.capTable = (CapTableBuilder *)local_238.super_MessageBuilder.arenaSpace[0];
  local_250.pointer = (WirePointer *)local_238.super_MessageBuilder.arenaSpace[1];
  PointerBuilder::getStructList(&local_278,&local_250,(StructSize)0x140006,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,&local_278,0);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_2c8._16_8_ + 4))->upper32Bits = 0x7b;
  local_250.segment = (SegmentBuilder *)local_238.super_MessageBuilder._vptr_MessageBuilder;
  local_250.capTable = (CapTableBuilder *)local_238.super_MessageBuilder.arenaSpace[0];
  local_250.pointer = (WirePointer *)local_238.super_MessageBuilder.arenaSpace[1];
  PointerBuilder::getStructList(&local_278,&local_250,(StructSize)0x140006,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,&local_278,1);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_2c8._16_8_ + 4))->upper32Bits = 0x1c8;
  local_250.pointer =
       (WirePointer *)
       ((long)&((WireValue<uint32_t> *)local_238.super_MessageBuilder.arenaSpace[1])->value +
       (ulong)(local_238.super_MessageBuilder.arenaSpace[2]._4_4_ >> 3));
  local_250.segment = (SegmentBuilder *)local_238.super_MessageBuilder._vptr_MessageBuilder;
  local_250.capTable = (CapTableBuilder *)local_238.super_MessageBuilder.arenaSpace[0];
  PointerBuilder::getStructList(&local_278,&local_250,(StructSize)0x140006,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)local_2c8,&local_278,0);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_2c8._16_8_ + 4))->upper32Bits = 0x315;
  AVar3 = MessageBuilder::getSegmentsForOutput(&local_120.super_MessageBuilder);
  params_2 = (AVar3.ptr)->ptr;
  pSVar1 = (SegmentBuilder *)(AVar3.ptr)->size_;
  MallocMessageBuilder::MallocMessageBuilder(&local_238,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_250,&local_238.super_MessageBuilder);
  local_278.ptr = (byte *)local_250.pointer;
  local_278.segment = local_250.segment;
  local_278.capTable = local_250.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)local_2c8,(PointerBuilder *)&local_278,(StructSize)0x10000,(word *)0x0
            );
  local_250.segment = (SegmentBuilder *)local_2c8._0_8_;
  local_250.capTable = (CapTableBuilder *)local_2c8._8_8_;
  local_250.pointer = local_2b0;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_278,&local_250,(StructSize)0xa0000,(word *)&DAT_002f8808);
  AVar3 = MessageBuilder::getSegmentsForOutput(&local_238.super_MessageBuilder);
  params_1 = (AVar3.ptr)->ptr;
  pSVar2 = (SegmentBuilder *)(AVar3.ptr)->size_;
  if ((pSVar2 != pSVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_2c8._0_8_ = pSVar2;
    local_278.segment = pSVar1;
    kj::_::Debug::log<char_const(&)[61],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x200,ERROR,
               "\"failed: expected \" \"(defaultSegment.size()) == (segment.size())\", defaultSegment.size(), segment.size()"
               ,(char (*) [61])"failed: expected (defaultSegment.size()) == (segment.size())",
               (unsigned_long *)local_2c8,(unsigned_long *)&local_278);
  }
  if (pSVar1 < pSVar2) {
    pSVar2 = pSVar1;
  }
  for (; pSVar2 != (SegmentBuilder *)0x0; pSVar2 = (SegmentBuilder *)&pSVar2[-1].field_0x37) {
    if ((params_1->content != params_2->content) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[139],unsigned_long_const&,unsigned_long_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x204,ERROR,
                 "\"failed: expected \" \"(reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i]) == (reinterpret_cast<const uint64_t*>(segment.begin())[i])\", reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i], reinterpret_cast<const uint64_t*>(segment.begin())[i]"
                 ,(char (*) [139])
                  "failed: expected (reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i]) == (reinterpret_cast<const uint64_t*>(segment.begin())[i])"
                 ,&params_1->content,&params_2->content);
    }
    params_2 = params_2 + 1;
    params_1 = params_1 + 1;
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_238);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Encoding, SmallStructLists) {
  // In this test, we will manually initialize TestListDefaults.lists to match the default
  // value and verify that we end up with the same encoding that the compiler produces.

  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestListDefaults>();
  auto sl = root.initLists();

  // Verify that all the lists are actually empty.
  EXPECT_EQ(0u, sl.getList0 ().size());
  EXPECT_EQ(0u, sl.getList1 ().size());
  EXPECT_EQ(0u, sl.getList8 ().size());
  EXPECT_EQ(0u, sl.getList16().size());
  EXPECT_EQ(0u, sl.getList32().size());
  EXPECT_EQ(0u, sl.getList64().size());
  EXPECT_EQ(0u, sl.getListP ().size());
  EXPECT_EQ(0u, sl.getInt32ListList().size());
  EXPECT_EQ(0u, sl.getTextListList().size());
  EXPECT_EQ(0u, sl.getStructListList().size());

  { auto l = sl.initList0 (2); l[0].setF(VOID);              l[1].setF(VOID); }
  { auto l = sl.initList1 (4); l[0].setF(true);              l[1].setF(false);
                               l[2].setF(true);              l[3].setF(true); }
  { auto l = sl.initList8 (2); l[0].setF(123u);              l[1].setF(45u); }
  { auto l = sl.initList16(2); l[0].setF(12345u);            l[1].setF(6789u); }
  { auto l = sl.initList32(2); l[0].setF(123456789u);        l[1].setF(234567890u); }
  { auto l = sl.initList64(2); l[0].setF(1234567890123456u); l[1].setF(2345678901234567u); }
  { auto l = sl.initListP (2); l[0].setF("foo");             l[1].setF("bar"); }

  {
    auto l = sl.initInt32ListList(3);
    l.set(0, {1, 2, 3});
    l.set(1, {4, 5});
    l.set(2, {12341234});
  }

  {
    auto l = sl.initTextListList(3);
    l.set(0, {"foo", "bar"});
    l.set(1, {"baz"});
    l.set(2, {"qux", "corge"});
  }

  {
    auto l = sl.initStructListList(2);
    l.init(0, 2);
    l.init(1, 1);

    l[0][0].setInt32Field(123);
    l[0][1].setInt32Field(456);
    l[1][0].setInt32Field(789);
  }

  kj::ArrayPtr<const word> segment = builder.getSegmentsForOutput()[0];

  // Initialize another message such that it copies the default value for that field.
  MallocMessageBuilder defaultBuilder;
  defaultBuilder.getRoot<TestListDefaults>().getLists();
  kj::ArrayPtr<const word> defaultSegment = defaultBuilder.getSegmentsForOutput()[0];

  // Should match...
  EXPECT_EQ(defaultSegment.size(), segment.size());

  for (size_t i = 0; i < kj::min(segment.size(), defaultSegment.size()); i++) {
    EXPECT_EQ(reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i],
              reinterpret_cast<const uint64_t*>(segment.begin())[i]);
  }
}